

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::EndpointInfo::getMessage(EndpointInfo *this,Time maxTime)

{
  GlobalHandle *pGVar1;
  long in_RDX;
  handle handle;
  unique_lock<std::shared_mutex> local_30;
  
  if (*(int *)(maxTime.internalTimeCode + 0xd0) < 1) {
LAB_00328915:
    (this->id).fed_id = 0;
    (this->id).handle = 0;
  }
  else {
    local_30._M_device = (mutex_type *)(maxTime.internalTimeCode + 0x98);
    local_30._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&local_30);
    local_30._M_owns = true;
    if (*(undefined8 **)(maxTime.internalTimeCode + 0x78) ==
        *(undefined8 **)(maxTime.internalTimeCode + 0x58)) {
      (this->id).fed_id = 0;
      (this->id).handle = 0;
    }
    else {
      if (in_RDX < *(long *)**(undefined8 **)(maxTime.internalTimeCode + 0x58)) {
        std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
        goto LAB_00328915;
      }
      if (0 < *(int *)(maxTime.internalTimeCode + 0xd0)) {
        LOCK();
        *(int *)(maxTime.internalTimeCode + 0xd0) = *(int *)(maxTime.internalTimeCode + 0xd0) + -1;
        UNLOCK();
      }
      pGVar1 = *(GlobalHandle **)(maxTime.internalTimeCode + 0x58);
      this->id = *pGVar1;
      pGVar1->fed_id = 0;
      pGVar1->handle = 0;
      std::
      deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::pop_front((deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)(maxTime.internalTimeCode + 0x48));
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> EndpointInfo::getMessage(Time maxTime)
{
    if (mAvailableMessages.load() > 0) {
        auto handle = message_queue.lock();
        if (handle->empty()) {
            return nullptr;
        }
        if (handle->front()->time <= maxTime) {
            if (mAvailableMessages > 0) {
                --mAvailableMessages;
            }
            auto msg = std::move(handle->front());
            handle->pop_front();
            return msg;
        }
    }
    return nullptr;
}